

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

void __thiscall OpenMD::Integrator::finalize(Integrator *this)

{
  DumpWriter::writeEor(this->dumpWriter);
  if (this->useRNEMD == true) {
    RNEMD::RNEMD::writeOutputFile
              ((this->rnemd_)._M_t.
               super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl);
  }
  ProgressBar::setStatus
            ((this->progressBar)._M_t.
             super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>.
             _M_t.
             super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
             .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl,this->runTime,
             this->runTime);
  ProgressBar::update((this->progressBar)._M_t.
                      super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                      .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl);
  StatWriter::writeStatReport(this->statWriter);
  return;
}

Assistant:

void Integrator::finalize() {
    dumpWriter->writeEor();
    if (useRNEMD) { rnemd_->writeOutputFile(); }
    progressBar->setStatus(runTime, runTime);
    progressBar->update();

    statWriter->writeStatReport();
  }